

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whereami.c
# Opt level: O0

int wai_getExecutablePath(char *out,int capacity,int *dirname_length)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  int *in_RDX;
  int in_ESI;
  void *in_RDI;
  int i;
  _Bool ok;
  int length;
  char *resolved;
  char buffer [4096];
  int local_1030;
  int local_102c;
  int local_1024;
  char local_1018 [4096];
  int *local_18;
  int local_c;
  void *local_8;
  
  local_1024 = -1;
  bVar1 = false;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    if ((bVar1) || (__s = realpath("/proc/self/exe",local_1018), __s == (char *)0x0)) {
      if (bVar1) {
        local_1030 = local_1024;
      }
      else {
        local_1030 = -1;
      }
      return local_1030;
    }
    sVar2 = strlen(__s);
    local_1024 = (int)sVar2;
    if ((local_1024 <= local_c) &&
       (memcpy(local_8,__s,(long)local_1024), local_102c = local_1024, local_18 != (int *)0x0)) {
      do {
        local_102c = local_102c + -1;
        if (local_102c < 0) goto LAB_0010d04e;
      } while (*(char *)((long)local_8 + (long)local_102c) != '/');
      *local_18 = local_102c;
    }
LAB_0010d04e:
    bVar1 = true;
  } while( true );
}

Assistant:

WAI_FUNCSPEC
int WAI_PREFIX(getExecutablePath)(char* out, int capacity, int* dirname_length)
{
  char buffer[PATH_MAX];
  char* resolved = NULL;
  int length = -1;
  bool ok;

  for (ok = false; !ok; ok = true)
  {
    resolved = realpath(WAI_PROC_SELF_EXE, buffer);
    if (!resolved)
      break;

    length = (int)strlen(resolved);
    if (length <= capacity)
    {
      memcpy(out, resolved, length);

      if (dirname_length)
      {
        int i;

        for (i = length - 1; i >= 0; --i)
        {
          if (out[i] == '/')
          {
            *dirname_length = i;
            break;
          }
        }
      }
    }
  }

  return ok ? length : -1;
}